

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionUtilsBullet.cpp
# Opt level: O3

bool chrono::collision::bt_utils::IntersectSegmentCylinder
               (cbtVector3 *sC,cbtVector3 *sD,cbtScalar sH,cbtVector3 *cC,cbtVector3 *cD,
               cbtScalar cH,cbtScalar cR,cbtScalar tol,cbtScalar *tMin,cbtScalar *tMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  cbtScalar cVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  float fVar14;
  undefined1 in_register_00001204 [60];
  undefined1 auVar16 [64];
  cbtScalar cVar17;
  float fVar18;
  undefined1 in_register_00001284 [60];
  undefined1 auVar19 [64];
  float fVar20;
  cbtScalar t2;
  cbtScalar t1;
  cbtScalar local_d0;
  cbtScalar local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  cbtScalar *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  cbtVector3 local_40;
  
  auVar19._4_60_ = in_register_00001284;
  auVar19._0_4_ = cR;
  auVar16._4_60_ = in_register_00001204;
  auVar16._0_4_ = sH;
  *tMin = -1e+18;
  *tMax = 1e+18;
  auVar13 = auVar16._0_16_;
  fVar14 = cD->m_floats[1];
  fVar18 = cD->m_floats[0];
  fVar1 = cD->m_floats[2];
  fVar2 = sC->m_floats[1] - cC->m_floats[1];
  fVar3 = sC->m_floats[0] - cC->m_floats[0];
  fVar4 = sC->m_floats[2] - cC->m_floats[2];
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(sD->m_floats[1] * fVar14)),ZEXT416((uint)fVar18),
                            ZEXT416((uint)sD->m_floats[0]));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar14)),ZEXT416((uint)fVar3),
                            ZEXT416((uint)fVar18));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar1),ZEXT416((uint)sD->m_floats[2]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar4),ZEXT416((uint)fVar1));
  auVar9 = vfnmadd231ss_avx512f(ZEXT416(0x3f800000),auVar11,auVar11);
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar9,auVar10);
  local_98 = auVar13;
  if (tol <= auVar10._0_4_) {
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)sD->m_floats[0]),ZEXT416((uint)fVar3),
                              ZEXT416((uint)(fVar2 * sD->m_floats[1])));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar3),
                              ZEXT416((uint)fVar3));
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)sD->m_floats[2]),ZEXT416((uint)fVar4),auVar10);
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar15,auVar12);
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    auVar10 = vfnmadd213ss_fma(auVar11,auVar15,auVar10);
    auVar11 = vfmadd231ss_fma(auVar13,auVar15,auVar12);
    auVar11 = vfnmadd213ss_fma(auVar19._0_16_,auVar19._0_16_,auVar11);
    auVar11 = vmulss_avx512f(auVar11,auVar9);
    auVar11 = vfmsub231ss_fma(auVar11,auVar10,auVar10);
    fVar14 = auVar11._0_4_;
    if (fVar14 < 0.0) {
      return false;
    }
    if (fVar14 < 0.0) {
      local_c8 = auVar9;
      local_b8 = auVar10;
      fVar14 = sqrtf(fVar14);
      auVar10 = local_b8;
      auVar9 = local_c8;
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar14 = auVar11._0_4_;
    }
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar10,auVar11);
    auVar11 = vdivss_avx512f(ZEXT416((uint)(auVar11._0_4_ - fVar14)),auVar9);
    auVar13 = vdivss_avx512f(ZEXT416((uint)(fVar14 - auVar10._0_4_)),auVar9);
    *tMin = auVar11._0_4_;
  }
  else {
    fVar20 = auVar15._0_4_;
    fVar2 = fVar2 - fVar14 * fVar20;
    auVar11 = ZEXT416((uint)(fVar3 - fVar18 * fVar20));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),auVar11,auVar11);
    auVar15 = ZEXT416((uint)(fVar4 - fVar1 * fVar20));
    auVar11 = vfmadd231ss_fma(auVar11,auVar15,auVar15);
    if (cR * cR < auVar11._0_4_) {
      return false;
    }
    auVar15._8_4_ = 0x80000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar15._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar13,auVar15);
    *tMin = auVar11._0_4_;
  }
  cVar17 = auVar13._0_4_;
  *tMax = cVar17;
  fVar14 = cD->m_floats[0];
  fVar18 = cD->m_floats[1];
  fVar1 = cD->m_floats[2];
  local_88._0_4_ = fVar14 * cH;
  local_c8._0_4_ = cC->m_floats[1];
  fVar3 = cC->m_floats[2];
  local_b8._0_4_ = cC->m_floats[0];
  local_58 = ZEXT416((uint)(fVar14 * cH + cC->m_floats[0]));
  local_68 = ZEXT416((uint)(fVar18 * cH + cC->m_floats[1]));
  auVar11 = vinsertps_avx(local_58,local_68,0x10);
  local_78 = ZEXT416((uint)(fVar1 * cH + fVar3));
  local_40.m_floats = (cbtScalar  [4])vinsertps_avx(auVar11,local_78,0x28);
  local_a0 = tMax;
  bVar6 = IntersectLinePlane(sC,sD,&local_40,cD,tol,&local_cc);
  local_b8 = ZEXT416((uint)((float)local_b8._0_4_ - (float)local_88._0_4_));
  local_c8 = ZEXT416((uint)((float)local_c8._0_4_ - fVar18 * cH));
  auVar11 = vinsertps_avx(local_b8,local_c8,0x10);
  local_88 = ZEXT416((uint)(fVar3 - fVar1 * cH));
  local_40.m_floats = (cbtScalar  [4])vinsertps_avx(auVar11,local_88,0x28);
  bVar7 = IntersectLinePlane(sC,sD,&local_40,cD,tol,&local_d0);
  if (bVar6 != bVar7) {
    __assert_fail("code1 == code2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionUtilsBullet.cpp"
                  ,0x11b,
                  "bool chrono::collision::bt_utils::IntersectSegmentCylinder(const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtScalar, const cbtScalar, cbtScalar &, cbtScalar &)"
                 );
  }
  if (bVar6 && bVar7) {
    auVar15 = vminss_avx(ZEXT416((uint)local_cc),ZEXT416((uint)local_d0));
    auVar11 = vmaxss_avx(ZEXT416((uint)local_d0),ZEXT416((uint)local_cc));
    auVar15 = vmaxss_avx(ZEXT416((uint)*tMin),auVar15);
    *tMin = auVar15._0_4_;
    auVar11 = vminss_avx(ZEXT416((uint)*local_a0),auVar11);
    cVar17 = auVar11._0_4_;
    *local_a0 = cVar17;
    cVar8 = *tMin;
    if (cVar17 < cVar8) {
      return false;
    }
  }
  else {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * ((float)local_68._0_4_ - sC->m_floats[1]))),
                              ZEXT416((uint)fVar14),
                              ZEXT416((uint)((float)local_58._0_4_ - sC->m_floats[0])));
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar1),
                              ZEXT416((uint)((float)local_78._0_4_ - sC->m_floats[2])));
    auVar11 = vandps_avx(auVar11,auVar9);
    if (cH + cH < auVar11._0_4_) {
      return false;
    }
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * ((float)local_c8._0_4_ - sC->m_floats[1]))),
                              ZEXT416((uint)fVar14),
                              ZEXT416((uint)((float)local_b8._0_4_ - sC->m_floats[0])));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar1),
                              ZEXT416((uint)((float)local_88._0_4_ - sC->m_floats[2])));
    auVar11 = vandps_avx(auVar11,auVar9);
    if (cH + cH < auVar11._0_4_) {
      return false;
    }
    cVar8 = *tMin;
  }
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar11 = vxorps_avx512vl(local_98,auVar13);
  fVar14 = auVar11._0_4_;
  if (((cVar8 < fVar14) && (cVar17 < fVar14)) ||
     ((fVar18 = local_98._0_4_, fVar18 < cVar8 && (fVar18 < cVar17)))) {
    return false;
  }
  if ((cVar8 < fVar14) || (fVar18 < cVar8)) {
    uVar5 = vcmpss_avx512f(ZEXT416((uint)cVar8),auVar11,1);
    bVar6 = (bool)((byte)uVar5 & 1);
    cVar8 = (cbtScalar)((uint)bVar6 * (int)fVar14 + (uint)!bVar6 * (int)fVar18);
    *tMin = cVar8;
    cVar17 = *local_a0;
  }
  if ((cVar17 < fVar14) || (auVar11 = local_98, fVar18 < cVar17)) {
    cVar17 = auVar11._0_4_;
    *local_a0 = cVar17;
    cVar8 = *tMin;
  }
  if (cVar17 < cVar8) {
    __assert_fail("tMin <= tMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionUtilsBullet.cpp"
                  ,0x137,
                  "bool chrono::collision::bt_utils::IntersectSegmentCylinder(const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtScalar, const cbtScalar, cbtScalar &, cbtScalar &)"
                 );
  }
  return true;
}

Assistant:

bool IntersectSegmentCylinder(const cbtVector3& sC,  // segment center point
                              const cbtVector3& sD,  // segment direction (unit vector)
                              const cbtScalar sH,    // segment half-length
                              const cbtVector3& cC,  // cylinder axis center
                              const cbtVector3& cD,  // cylinder axis direction (unit vector)
                              const cbtScalar cH,    // cylinder axis half-length (cylinder halh-height)
                              const cbtScalar cR,    // cylinder radius
                              const cbtScalar tol,   // tolerance for parallelism test
                              cbtScalar& tMin,       // segment parameter of first intersection point
                              cbtScalar& tMax        // segment parameter of second intersection point
) {
    tMin = -BT_LARGE_FLOAT;
    tMax = +BT_LARGE_FLOAT;

    cbtVector3 v = sC - cC;
    cbtScalar cDsD = cD.dot(sD);
    cbtScalar vcD = v.dot(cD);
    cbtScalar vsD = v.dot(sD);
    cbtScalar vv = v.dot(v);
    cbtScalar a = 1 - cDsD * cDsD;
    cbtScalar b = vsD - vcD * cDsD;
    cbtScalar c = vv - vcD * vcD - cR * cR;

    // Intersection with cylindrical surface.
    // a >= 0 always
    // a == 0 indicates line parallel to cylinder axis
    if (std::abs(a) < tol) {
        // line parallel to cylinder axis
        cbtScalar dist2 = (v - vcD * cD).length2();
        if (dist2 > cR * cR)
            return false;
        tMin = -sH;
        tMax = +sH;
    } else {
        // line intersects cylindrical surface
        cbtScalar discr = b * b - a * c;
        if (discr < 0)
            return false;  // no real roots, no intersection
        discr = cbtSqrt(discr);
        tMin = (-b - discr) / a;
        tMax = (-b + discr) / a;
    }

    // Intersection with end-caps.
    cbtScalar t1;
    bool code1 = IntersectLinePlane(sC, sD, cC + cH * cD, cD, tol, t1);
    cbtScalar t2;
    bool code2 = IntersectLinePlane(sC, sD, cC - cH * cD, cD, tol, t2);
    assert(code1 == code2);
    if (code1 && code2) {
        // line intersects end-caps
        if (t1 < t2) {
            tMin = cbtMax(tMin, t1);
            tMax = cbtMin(tMax, t2);
        } else {
            tMin = cbtMax(tMin, t2);
            tMax = cbtMin(tMax, t1);
        }
        if (tMax < tMin)
            return false;
    } else {
        // line parallel to end-cap planes
        cbtScalar d1 = std::abs(cD.dot(cC + cH * cD - sC));
        cbtScalar d2 = std::abs(cD.dot(cC - cH * cD - sC));
        if (d1 > 2 * cH || d2 > 2 * cH)
            return false;
    }

    // If both intersection points are outside the segment, no intersection
    if ((tMin < -sH && tMax < -sH) || (tMin > +sH && tMax > +sH))
        return false;

    // Clamp to segment length
    cbtClamp(tMin, -sH, +sH);
    cbtClamp(tMax, -sH, +sH);

    assert(tMin <= tMax);

    return true;
}